

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O0

long AdsSyncWriteControlReqEx
               (long port,AmsAddr *pAddr,uint16_t adsState,uint16_t devState,uint32_t bufferLength,
               void *buffer)

{
  AmsRouter *this;
  bad_alloc *anon_var_0;
  undefined1 local_78 [8];
  AmsRequest request;
  void *buffer_local;
  uint32_t bufferLength_local;
  uint16_t devState_local;
  uint16_t adsState_local;
  AmsAddr *pAddr_local;
  long port_local;
  
  if ((port < 1) || (0xffff < port)) {
    port_local = 0x748;
  }
  else if (pAddr == (AmsAddr *)0x0) {
    port_local = 0x749;
  }
  else {
    pAddr_local._0_2_ = (uint16_t)port;
    request.deadline.__d.__r = (duration)(duration)buffer;
    AmsRequest::AmsRequest
              ((AmsRequest *)local_78,pAddr,(uint16_t)pAddr_local,5,0,(void *)0x0,(uint32_t *)0x0,
               (ulong)bufferLength + 8);
    Frame::prepend((Frame *)local_78,(void *)request.deadline.__d.__r,(ulong)bufferLength);
    AdsWriteCtrlRequest::AdsWriteCtrlRequest
              ((AdsWriteCtrlRequest *)((long)&anon_var_0 + 4),adsState,devState,bufferLength);
    Frame::prepend<AdsWriteCtrlRequest>
              ((Frame *)local_78,(AdsWriteCtrlRequest *)((long)&anon_var_0 + 4));
    this = GetRouter();
    port_local = AmsRouter::AdsRequest(this,(AmsRequest *)local_78);
    AmsRequest::~AmsRequest((AmsRequest *)local_78);
  }
  return port_local;
}

Assistant:

long AdsSyncWriteControlReqEx(long           port,
                              const AmsAddr* pAddr,
                              uint16_t       adsState,
                              uint16_t       devState,
                              uint32_t       bufferLength,
                              const void*    buffer)
{
    ASSERT_PORT_AND_AMSADDR(port, pAddr);
    try {
        AmsRequest request {
            *pAddr,
            (uint16_t)port,
            AoEHeader::WRITE_CONTROL,
            0, nullptr, nullptr,
            sizeof(AdsWriteCtrlRequest) + bufferLength
        };
        request.frame.prepend(buffer, bufferLength);
        request.frame.prepend<AdsWriteCtrlRequest>({
            adsState,
            devState,
            bufferLength
        });
        return GetRouter().AdsRequest(request);
    } catch (const std::bad_alloc&) {
        return GLOBALERR_NO_MEMORY;
    }
}